

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O0

Vec_Int_t * Nwk_ManLutMerge(Nwk_Man_t *pNtk,void *pParsInit)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  abctime aVar9;
  Nwk_Obj_t *pNVar10;
  Nwk_Grf_t *p_00;
  Vec_Ptr_t *vStart_00;
  Vec_Ptr_t *vNext_00;
  Vec_Ptr_t *vCands;
  Vec_Ptr_t *vCands_00;
  Nwk_Obj_t *pNVar11;
  abctime aVar12;
  abctime clk;
  int nCands;
  int nVertsMax;
  int k;
  int i;
  Nwk_Obj_t *pCand;
  Nwk_Obj_t *pLut;
  Vec_Ptr_t *vCands2;
  Vec_Ptr_t *vCands1;
  Vec_Ptr_t *vNext;
  Vec_Ptr_t *vStart;
  Vec_Int_t *vResult;
  Nwk_Grf_t *p;
  Nwk_LMPars_t *pPars;
  void *pParsInit_local;
  Nwk_Man_t *pNtk_local;
  
  aVar9 = Abc_Clock();
  clk._4_4_ = 0;
  for (nVertsMax = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), nVertsMax < iVar2; nVertsMax = nVertsMax + 1
      ) {
    pNVar10 = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vObjs,nVertsMax);
    if ((pNVar10 != (Nwk_Obj_t *)0x0) && (iVar2 = Nwk_ObjIsNode(pNVar10), iVar2 != 0)) {
      iVar2 = Nwk_ObjFaninNum(pNVar10);
      clk._4_4_ = (uint)(iVar2 <= *pParsInit) + clk._4_4_;
    }
  }
  p_00 = Nwk_ManGraphAlloc(clk._4_4_);
  vStart_00 = Vec_PtrAlloc(1000);
  vNext_00 = Vec_PtrAlloc(1000);
  vCands = Vec_PtrAlloc(1000);
  vCands_00 = Vec_PtrAlloc(1000);
  clk._0_4_ = 0;
  for (nVertsMax = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), nVertsMax < iVar2; nVertsMax = nVertsMax + 1
      ) {
    pNVar10 = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vObjs,nVertsMax);
    if (((pNVar10 != (Nwk_Obj_t *)0x0) && (iVar2 = Nwk_ObjIsNode(pNVar10), iVar2 != 0)) &&
       (iVar2 = Nwk_ObjFaninNum(pNVar10), iVar2 <= *pParsInit)) {
      Nwk_ManCollectOverlapCands(pNVar10,vCands,(Nwk_LMPars_t *)pParsInit);
      if (*(int *)((long)pParsInit + 0x14) != 0) {
        Nwk_ManCollectNonOverlapCands
                  (pNVar10,vStart_00,vNext_00,vCands_00,(Nwk_LMPars_t *)pParsInit);
      }
      iVar2 = Vec_PtrSize(vCands);
      if ((iVar2 != 0) || (iVar2 = Vec_PtrSize(vCands_00), iVar2 != 0)) {
        iVar2 = Vec_PtrSize(vCands);
        iVar3 = Vec_PtrSize(vCands_00);
        clk._0_4_ = iVar2 + iVar3 + (uint)clk;
        for (nCands = 0; iVar2 = Vec_PtrSize(vCands), nCands < iVar2; nCands = nCands + 1) {
          pNVar11 = (Nwk_Obj_t *)Vec_PtrEntry(vCands,nCands);
          iVar2 = Nwk_ObjId(pNVar10);
          iVar3 = Nwk_ObjId(pNVar11);
          Nwk_ManGraphHashEdge(p_00,iVar2,iVar3);
        }
        for (nCands = 0; iVar2 = Vec_PtrSize(vCands_00), nCands < iVar2; nCands = nCands + 1) {
          pNVar11 = (Nwk_Obj_t *)Vec_PtrEntry(vCands_00,nCands);
          iVar2 = Nwk_ObjId(pNVar10);
          iVar3 = Nwk_ObjId(pNVar11);
          Nwk_ManGraphHashEdge(p_00,iVar2,iVar3);
        }
        if (*(int *)((long)pParsInit + 0x1c) != 0) {
          uVar4 = Nwk_ObjId(pNVar10);
          uVar5 = Nwk_ObjFaninNum(pNVar10);
          uVar6 = Nwk_ObjFaninNum(pNVar10);
          uVar7 = Vec_PtrSize(vCands);
          uVar8 = Vec_PtrSize(vCands_00);
          printf("Node %6d : Fanins = %d. Fanouts = %3d.  Cand1 = %3d. Cand2 = %3d.\n",(ulong)uVar4,
                 (ulong)uVar5,(ulong)uVar6,(ulong)uVar7,(ulong)uVar8);
        }
      }
    }
  }
  Vec_PtrFree(vStart_00);
  Vec_PtrFree(vNext_00);
  Vec_PtrFree(vCands);
  Vec_PtrFree(vCands_00);
  if (*(int *)((long)pParsInit + 0x20) != 0) {
    printf("Mergable LUTs = %6d. Total cands = %6d. ",(ulong)(uint)p_00->nVertsMax,(ulong)(uint)clk)
    ;
    Abc_Print(1,"%s =","Deriving graph");
    aVar12 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar12 - aVar9) * 1.0) / 1000000.0);
  }
  aVar9 = Abc_Clock();
  Nwk_ManGraphSolve(p_00);
  if (*(int *)((long)pParsInit + 0x20) != 0) {
    uVar4 = p_00->nVerts;
    uVar5 = p_00->nEdges;
    iVar2 = Vec_IntSize(p_00->vPairs);
    printf("GRAPH: Nodes = %6d. Edges = %6d.  Pairs = %6d.  ",(ulong)uVar4,(ulong)uVar5,
           (long)iVar2 / 2 & 0xffffffff);
    Abc_Print(1,"%s =","Solving");
    aVar12 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar12 - aVar9) * 1.0) / 1000000.0);
    Nwk_ManGraphReportMemoryUsage(p_00);
  }
  pVVar1 = p_00->vPairs;
  p_00->vPairs = (Vec_Int_t *)0x0;
  Nwk_ManGraphFree(p_00);
  return pVVar1;
}

Assistant:

Vec_Int_t * Nwk_ManLutMerge( Nwk_Man_t * pNtk, void * pParsInit )
{
    Nwk_LMPars_t * pPars = (Nwk_LMPars_t *)pParsInit;
    Nwk_Grf_t * p;
    Vec_Int_t * vResult;
    Vec_Ptr_t * vStart, * vNext, * vCands1, * vCands2;
    Nwk_Obj_t * pLut, * pCand;
    int i, k, nVertsMax, nCands;
    abctime clk = Abc_Clock();
    // count the number of vertices
    nVertsMax = 0;
    Nwk_ManForEachNode( pNtk, pLut, i )
        nVertsMax += (int)(Nwk_ObjFaninNum(pLut) <= pPars->nMaxLutSize);
    p = Nwk_ManGraphAlloc( nVertsMax );
    // create graph
    vStart  = Vec_PtrAlloc( 1000 );
    vNext   = Vec_PtrAlloc( 1000 );
    vCands1 = Vec_PtrAlloc( 1000 );
    vCands2 = Vec_PtrAlloc( 1000 );
    nCands  = 0;
    Nwk_ManForEachNode( pNtk, pLut, i )
    {
        if ( Nwk_ObjFaninNum(pLut) > pPars->nMaxLutSize )
            continue;
        Nwk_ManCollectOverlapCands( pLut, vCands1, pPars );
        if ( pPars->fUseDiffSupp )
            Nwk_ManCollectNonOverlapCands( pLut, vStart, vNext, vCands2, pPars );
        if ( Vec_PtrSize(vCands1) == 0 && Vec_PtrSize(vCands2) == 0 )
            continue;
        nCands += Vec_PtrSize(vCands1) + Vec_PtrSize(vCands2);
        // save candidates
        Vec_PtrForEachEntry( Nwk_Obj_t *, vCands1, pCand, k )
            Nwk_ManGraphHashEdge( p, Nwk_ObjId(pLut), Nwk_ObjId(pCand) );
        Vec_PtrForEachEntry( Nwk_Obj_t *, vCands2, pCand, k )
            Nwk_ManGraphHashEdge( p, Nwk_ObjId(pLut), Nwk_ObjId(pCand) );
        // print statistics about this node
        if ( pPars->fVeryVerbose )
        printf( "Node %6d : Fanins = %d. Fanouts = %3d.  Cand1 = %3d. Cand2 = %3d.\n",
            Nwk_ObjId(pLut), Nwk_ObjFaninNum(pLut), Nwk_ObjFaninNum(pLut), 
            Vec_PtrSize(vCands1), Vec_PtrSize(vCands2) );
    }
    Vec_PtrFree( vStart );
    Vec_PtrFree( vNext );
    Vec_PtrFree( vCands1 );
    Vec_PtrFree( vCands2 );
    if ( pPars->fVerbose )
    {
        printf( "Mergable LUTs = %6d. Total cands = %6d. ", p->nVertsMax, nCands );
        ABC_PRT( "Deriving graph", Abc_Clock() - clk );
    }
    // solve the graph problem
    clk = Abc_Clock();
    Nwk_ManGraphSolve( p );
    if ( pPars->fVerbose )
    {
        printf( "GRAPH: Nodes = %6d. Edges = %6d.  Pairs = %6d.  ", 
            p->nVerts, p->nEdges, Vec_IntSize(p->vPairs)/2 );
        ABC_PRT( "Solving", Abc_Clock() - clk );
        Nwk_ManGraphReportMemoryUsage( p );
    }
    vResult = p->vPairs; p->vPairs = NULL;
/*
    for ( i = 0; i < vResult->nSize; i += 2 )
        printf( "(%d,%d) ", vResult->pArray[i], vResult->pArray[i+1] );
    printf( "\n" );
*/
    Nwk_ManGraphFree( p );
    return vResult;
}